

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::js::api::json::PsbtBip32PubkeyInput::ConvertFromStruct
          (PsbtBip32PubkeyInput *this,PsbtBip32PubkeyInputStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->descriptor_);
  std::__cxx11::string::_M_assign((string *)&this->pubkey_);
  std::__cxx11::string::_M_assign((string *)&this->master_fingerprint_);
  std::__cxx11::string::_M_assign((string *)&this->path_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void PsbtBip32PubkeyInput::ConvertFromStruct(
    const PsbtBip32PubkeyInputStruct& data) {
  descriptor_ = data.descriptor;
  pubkey_ = data.pubkey;
  master_fingerprint_ = data.master_fingerprint;
  path_ = data.path;
  ignore_items = data.ignore_items;
}